

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O2

void __thiscall
cinatra::coro_http_response::set_status_and_content_view<std::__cxx11::string>
          (coro_http_response *this,status_type status,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> content,
          content_encoding encoding,bool is_view,string_view client_encoding_type)

{
  pointer pcVar1;
  bool bVar2;
  size_type sVar3;
  undefined7 in_register_00000009;
  string *psVar4;
  undefined4 in_register_00000014;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  int level;
  string_view data;
  string_view str_src;
  allocator<char> local_c1;
  string encode_str;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(in_register_00000014,encoding);
  psVar4 = (string *)CONCAT71(in_register_00000009,is_view);
  level = (int)client_encoding_type._M_len;
  this->status_ = status;
  if ((int)psVar4 == 1) {
    if (content._M_dataplus._M_p != (pointer)0x0) {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)&content,"deflate",0);
      if (sVar3 == 0xffffffffffffffff) goto LAB_001866cc;
    }
    encode_str._M_string_length = 0;
    encode_str.field_2._M_local_buf[0] = '\0';
    str_src._M_str = (char *)&encode_str;
    str_src._M_len = (size_t)(__str->_M_dataplus)._M_p;
    encode_str._M_dataplus._M_p = (pointer)&encode_str.field_2;
    bVar2 = gzip_codec::deflate((gzip_codec *)__str->_M_string_length,str_src,psVar4);
    if (bVar2) {
      add_header<char_const*,char_const*>(this,"Content-Encoding","deflate");
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)encode_str._M_dataplus._M_p == &encode_str.field_2) {
        local_a0.field_2._8_8_ = encode_str.field_2._8_8_;
      }
      else {
        local_a0._M_dataplus._M_p = encode_str._M_dataplus._M_p;
      }
      local_a0.field_2._M_allocated_capacity._1_7_ = encode_str.field_2._M_allocated_capacity._1_7_;
      local_a0.field_2._M_local_buf[0] = encode_str.field_2._M_local_buf[0];
      psVar4 = &local_a0;
LAB_001867a4:
      encode_str._M_dataplus._M_p = (pointer)&encode_str.field_2;
      psVar4->_M_string_length = encode_str._M_string_length;
      encode_str._M_string_length = 0;
      encode_str.field_2._M_local_buf[0] = '\0';
      set_content(this,psVar4);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"deflate compress error",&local_c1);
      set_status_and_content
                (this,internal_server_error,&local_80,none,(string_view)(ZEXT816(0x26d00e) << 0x40))
      ;
      psVar4 = &local_80;
    }
  }
  else {
    if ((int)psVar4 != 0) {
LAB_001866cc:
      if ((char)client_encoding_type._M_len == '\0') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&this->content_,__str);
      }
      else {
        pcVar1 = (__str->_M_dataplus)._M_p;
        (this->content_view_)._M_len = __str->_M_string_length;
        (this->content_view_)._M_str = pcVar1;
      }
      goto LAB_001867d5;
    }
    if (content._M_dataplus._M_p != (pointer)0x0) {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)&content,"gzip",0);
      if (sVar3 == 0xffffffffffffffff) goto LAB_001866cc;
    }
    encode_str._M_string_length = 0;
    encode_str.field_2._M_local_buf[0] = '\0';
    data._M_str = (char *)&encode_str;
    data._M_len = (size_t)(__str->_M_dataplus)._M_p;
    encode_str._M_dataplus._M_p = (pointer)&encode_str.field_2;
    bVar2 = gzip_codec::compress
                      ((gzip_codec *)__str->_M_string_length,data,(string *)0xffffffffffffffff,level
                      );
    if (bVar2) {
      add_header<char_const*,char_const*>(this,"Content-Encoding","gzip");
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)encode_str._M_dataplus._M_p == &encode_str.field_2) {
        local_60.field_2._8_8_ = encode_str.field_2._8_8_;
      }
      else {
        local_60._M_dataplus._M_p = encode_str._M_dataplus._M_p;
      }
      local_60.field_2._M_allocated_capacity._1_7_ = encode_str.field_2._M_allocated_capacity._1_7_;
      local_60.field_2._M_local_buf[0] = encode_str.field_2._M_local_buf[0];
      psVar4 = &local_60;
      goto LAB_001867a4;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"gzip compress error",&local_c1);
    set_status_and_content
              (this,internal_server_error,&local_40,none,(string_view)(ZEXT816(0x26d00e) << 0x40));
    psVar4 = &local_40;
  }
  std::__cxx11::string::~string((string *)psVar4);
  std::__cxx11::string::~string((string *)&encode_str);
LAB_001867d5:
  this->has_set_content_ = true;
  return;
}

Assistant:

void set_status_and_content_view(
      status_type status, String content = "",
      content_encoding encoding = content_encoding::none, bool is_view = true,
      std::string_view client_encoding_type = "") {
    status_ = status;
#ifdef CINATRA_ENABLE_GZIP
    if (encoding == content_encoding::gzip) {
      if (client_encoding_type.empty() ||
          client_encoding_type.find("gzip") != std::string_view::npos) {
        std::string encode_str;
        bool r = gzip_codec::compress(content, encode_str);
        if (!r) {
          set_status_and_content(status_type::internal_server_error,
                                 "gzip compress error");
        }
        else {
          add_header("Content-Encoding", "gzip");
          set_content(std::move(encode_str));
        }
      }
      else {
        if (is_view) {
          content_view_ = content;
        }
        else {
          content_ = std::move(content);
        }
      }
      has_set_content_ = true;
      return;
    }

    if (encoding == content_encoding::deflate) {
      if (client_encoding_type.empty() ||
          client_encoding_type.find("deflate") != std::string_view::npos) {
        std::string deflate_str;
        bool r = gzip_codec::deflate(content, deflate_str);
        if (!r) {
          set_status_and_content(status_type::internal_server_error,
                                 "deflate compress error");
        }
        else {
          add_header("Content-Encoding", "deflate");
          set_content(std::move(deflate_str));
        }
      }
      else {
        if (is_view) {
          content_view_ = content;
        }
        else {
          content_ = std::move(content);
        }
      }
      has_set_content_ = true;
      return;
    }
#endif

#ifdef CINATRA_ENABLE_BROTLI
    if (encoding == content_encoding::br) {
      if (client_encoding_type.empty() ||
          client_encoding_type.find("br") != std::string_view::npos) {
        std::string br_str;
        bool r = br_codec::brotli_compress(content, br_str);
        if (!r) {
          set_status_and_content(status_type::internal_server_error,
                                 "br compress error");
        }
        else {
          add_header("Content-Encoding", "br");
          set_content(std::move(br_str));
        }
      }
      else {
        if (is_view) {
          content_view_ = content;
        }
        else {
          content_ = std::move(content);
        }
      }
      has_set_content_ = true;
      return;
    }
#endif

    if (is_view) {
      content_view_ = content;
    }
    else {
      content_ = std::move(content);
    }
    has_set_content_ = true;
  }